

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_getfile(HSQUIRRELVM v,SQInteger idx,SQFILE *file)

{
  SQRESULT SVar1;
  _func_int **pp_Var2;
  HSQUIRRELVM in_RDX;
  SQUserPointer *in_RSI;
  SQInteger in_RDI;
  SQFile *fileobj;
  SQFile *this;
  HSQUIRRELVM in_stack_fffffffffffffff8;
  
  this = (SQFile *)0x0;
  SVar1 = sq_getinstanceup(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX);
  if (SVar1 < 0) {
    SVar1 = sq_throwerror(in_RDX,(SQChar *)this);
  }
  else {
    pp_Var2 = (_func_int **)SQFile::GetHandle(this);
    (in_RDX->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted = pp_Var2;
    SVar1 = 0;
  }
  return SVar1;
}

Assistant:

SQRESULT sqstd_getfile(HSQUIRRELVM v, SQInteger idx, SQFILE *file)
{
    SQFile *fileobj = NULL;
    if(SQ_SUCCEEDED(sq_getinstanceup(v,idx,(SQUserPointer*)&fileobj,(SQUserPointer)SQSTD_FILE_TYPE_TAG))) {
        *file = fileobj->GetHandle();
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("not a file"));
}